

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O1

void __thiscall OpenMD::COHZ::writeCorrelate(COHZ *this)

{
  pointer pcVar1;
  double *pdVar2;
  long lVar3;
  undefined8 uVar4;
  char cVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  Revision r;
  string OHfile;
  string Dfile;
  string HHfile;
  ofstream ofs2;
  ofstream ofs1;
  ofstream ofs3;
  Revision local_6b9;
  string local_6b8;
  ulong local_698;
  long *local_690 [2];
  long local_680 [2];
  long *local_670 [2];
  long local_660 [2];
  long *local_650 [2];
  long local_640 [2];
  long local_630;
  filebuf local_628 [240];
  ios_base aiStack_538 [264];
  long local_430;
  filebuf local_428 [240];
  ios_base aiStack_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  local_670[0] = local_660;
  pcVar1 = (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
           super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
           super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.super_DynamicProperty.outputFilename_.
           _M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_670,pcVar1,
             pcVar1 + (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                      super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                      super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.super_DynamicProperty.
                      outputFilename_._M_string_length);
  std::__cxx11::string::append((char *)local_670);
  local_690[0] = local_680;
  pcVar1 = (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
           super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
           super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.super_DynamicProperty.outputFilename_.
           _M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_690,pcVar1,
             pcVar1 + (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                      super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                      super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.super_DynamicProperty.
                      outputFilename_._M_string_length);
  std::__cxx11::string::append((char *)local_690);
  local_650[0] = local_640;
  pcVar1 = (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
           super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
           super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.super_DynamicProperty.outputFilename_.
           _M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_650,pcVar1,
             pcVar1 + (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                      super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                      super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.super_DynamicProperty.
                      outputFilename_._M_string_length);
  std::__cxx11::string::append((char *)local_650);
  std::ofstream::ofstream(&local_430,(char *)local_670[0],_S_out);
  std::ofstream::ofstream(&local_630,(char *)local_690[0],_S_out);
  std::ofstream::ofstream(&local_230,(char *)local_650[0],_S_out);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    snprintf(painCave.errMsg,2000,"COHz::writeCorrelate Error: failed to open %s\n");
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,"# ",2);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_430,
                        (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.corrFuncType_._M_dataplus.
                        _M_p,(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                             super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                             super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.corrFuncType_.
                             _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," for dipole vectors in water\n",0x1d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_6b8,&local_6b9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_430,local_6b8._M_dataplus._M_p,local_6b8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_6b8,&local_6b9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_430,local_6b8._M_dataplus._M_p,local_6b8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_430,"# selection script1: \"",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_430,
               (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript1_._M_dataplus._M_p,
               (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript1_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_430,"\"\tselection script2: \"",0x16);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_430,
                        (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript2_.
                        _M_dataplus._M_p,
                        (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript2_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_430,"# privilegedAxis computed as ",0x1d);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_430,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," axis \n",7);
    if ((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,"# parameters: ",0xe)
      ;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_430,
                          (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                          super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                          super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_._M_dataplus.
                          _M_p,(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_.
                               _M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_430,"#time\tPn(costheta_z)\n",0x15);
    if ((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.nTimeBins_ != 0) {
      uVar7 = 0;
      do {
        pdVar2 = (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                 super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                 super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.times_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        local_698 = uVar7;
        std::ostream::_M_insert<double>(pdVar2[uVar7] - *pdVar2);
        uVar7 = local_698;
        if (this->nZBins_ != 0) {
          lVar9 = 0;
          uVar8 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,"\t",1);
            std::ostream::_M_insert<double>
                      (*(double *)
                        (*(long *)&(this->histogram_).
                                   super__Vector_base<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                   super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                                   ._M_impl.super__Vector_impl_data + lVar9));
            uVar8 = uVar8 + 1;
            lVar9 = lVar9 + 0x20;
          } while (uVar8 < this->nZBins_);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,"\n",1);
        uVar7 = local_698 + 1;
      } while (uVar7 < (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                       super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                       super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.nTimeBins_);
    }
  }
  std::ofstream::close();
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    snprintf(painCave.errMsg,2000,"COHz::writeCorrelate Error: failed to open %s\n");
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_630,"# ",2);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_630,
                        (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.corrFuncType_._M_dataplus.
                        _M_p,(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                             super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                             super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.corrFuncType_.
                             _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," for OH bond vectors in water\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_630,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_6b8,&local_6b9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_630,local_6b8._M_dataplus._M_p,local_6b8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_630,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_6b8,&local_6b9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_630,local_6b8._M_dataplus._M_p,local_6b8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_630,"# selection script1: \"",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_630,
               (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript1_._M_dataplus._M_p,
               (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript1_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_630,"\"\tselection script2: \"",0x16);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_630,
                        (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript2_.
                        _M_dataplus._M_p,
                        (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript2_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_630,"# privilegedAxis computed as ",0x1d);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_630,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," axis \n",7);
    if ((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_630,"# parameters: ",0xe)
      ;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_630,
                          (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                          super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                          super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_._M_dataplus.
                          _M_p,(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_.
                               _M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_630,"#time\tPn(costheta_z)\n",0x15);
    if ((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.nTimeBins_ != 0) {
      uVar7 = 0;
      do {
        pdVar2 = (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                 super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                 super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.times_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        local_698 = uVar7;
        std::ostream::_M_insert<double>(pdVar2[uVar7] - *pdVar2);
        uVar7 = local_698;
        if (this->nZBins_ != 0) {
          lVar9 = 0x10;
          uVar8 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_630,"\t",1);
            lVar3 = *(long *)&(this->histogram_).
                              super__Vector_base<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar7].
                              super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                              ._M_impl.super__Vector_impl_data;
            std::ostream::_M_insert<double>
                      ((*(double *)(lVar3 + -8 + lVar9) + *(double *)(lVar3 + lVar9)) * 0.5);
            uVar8 = uVar8 + 1;
            lVar9 = lVar9 + 0x20;
          } while (uVar8 < this->nZBins_);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_630,"\n",1);
        uVar7 = local_698 + 1;
      } while (uVar7 < (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                       super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                       super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.nTimeBins_);
    }
  }
  std::ofstream::close();
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    snprintf(painCave.errMsg,2000,"COHz::writeCorrelate Error: failed to open %s\n",local_650[0]);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.corrFuncType_._M_dataplus.
                        _M_p,(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                             super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                             super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.corrFuncType_.
                             _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," for HH bond vectors in water\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_6b8,&local_6b9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_6b8._M_dataplus._M_p,local_6b8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_6b8,&local_6b9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_6b8._M_dataplus._M_p,local_6b8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# selection script1: \"",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,
               (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript1_._M_dataplus._M_p,
               (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript1_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"\"\tselection script2: \"",0x16);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript2_.
                        _M_dataplus._M_p,
                        (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.selectionScript2_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# privilegedAxis computed as ",0x1d);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," axis \n",7);
    if ((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# parameters: ",0xe)
      ;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,
                          (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                          super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                          super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_._M_dataplus.
                          _M_p,(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                               super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                               super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.paramString_.
                               _M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"#time\tPn(costheta_z)\n",0x15);
    if ((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.nTimeBins_ != 0) {
      uVar7 = 0;
      do {
        pdVar2 = (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                 super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                 super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.times_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        local_698 = uVar7;
        std::ostream::_M_insert<double>(pdVar2[uVar7] - *pdVar2);
        uVar7 = local_698;
        if (this->nZBins_ != 0) {
          lVar9 = 0x18;
          uVar8 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            std::ostream::_M_insert<double>
                      (*(double *)
                        (*(long *)&(this->histogram_).
                                   super__Vector_base<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                   super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                                   ._M_impl.super__Vector_impl_data + lVar9));
            uVar8 = uVar8 + 1;
            lVar9 = lVar9 + 0x20;
          } while (uVar8 < this->nZBins_);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
        uVar7 = local_698 + 1;
      } while (uVar7 < (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                       super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                       super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.nTimeBins_);
    }
  }
  std::ofstream::close();
  uVar4 = ___throw_bad_array_new_length;
  lVar9 = _VTT;
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(aiStack_138);
  local_630 = lVar9;
  *(undefined8 *)(local_628 + *(long *)(lVar9 + -0x18) + -8) = uVar4;
  std::filebuf::~filebuf(local_628);
  std::ios_base::~ios_base(aiStack_538);
  local_430 = lVar9;
  *(undefined8 *)(local_428 + *(long *)(lVar9 + -0x18) + -8) = uVar4;
  std::filebuf::~filebuf(local_428);
  std::ios_base::~ios_base(aiStack_338);
  if (local_650[0] != local_640) {
    operator_delete(local_650[0],local_640[0] + 1);
  }
  if (local_690[0] != local_680) {
    operator_delete(local_690[0],local_680[0] + 1);
  }
  if (local_670[0] != local_660) {
    operator_delete(local_670[0],local_660[0] + 1);
  }
  return;
}

Assistant:

void COHZ::writeCorrelate() {
    std::string Dfile  = getOutputFileName() + "D";
    std::string OHfile = getOutputFileName() + "OH";
    std::string HHfile = getOutputFileName() + "HH";

    std::ofstream ofs1(Dfile.c_str());
    std::ofstream ofs2(OHfile.c_str());
    std::ofstream ofs3(HHfile.c_str());

    if (ofs1.is_open()) {
      Revision r;

      ofs1 << "# " << getCorrFuncType() << " for dipole vectors in water\n";
      ofs1 << "# OpenMD " << r.getFullRevision() << "\n";
      ofs1 << "# " << r.getBuildDate() << "\n";
      ofs1 << "# selection script1: \"" << selectionScript1_;
      ofs1 << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      ofs1 << "# privilegedAxis computed as " << axisLabel_ << " axis \n";
      if (!paramString_.empty())
        ofs1 << "# parameters: " << paramString_ << "\n";

      ofs1 << "#time\tPn(costheta_z)\n";

      for (unsigned int i = 0; i < nTimeBins_; ++i) {
        ofs1 << times_[i] - times_[0];

        for (unsigned int j = 0; j < nZBins_; ++j) {
          ofs1 << "\t" << histogram_[i][j][0];
        }
        ofs1 << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "COHz::writeCorrelate Error: failed to open %s\n",
               Dfile.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs1.close();

    if (ofs2.is_open()) {
      Revision r;

      ofs2 << "# " << getCorrFuncType() << " for OH bond vectors in water\n";
      ofs2 << "# OpenMD " << r.getFullRevision() << "\n";
      ofs2 << "# " << r.getBuildDate() << "\n";
      ofs2 << "# selection script1: \"" << selectionScript1_;
      ofs2 << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      ofs2 << "# privilegedAxis computed as " << axisLabel_ << " axis \n";
      if (!paramString_.empty())
        ofs2 << "# parameters: " << paramString_ << "\n";

      ofs2 << "#time\tPn(costheta_z)\n";

      for (unsigned int i = 0; i < nTimeBins_; ++i) {
        ofs2 << times_[i] - times_[0];

        for (unsigned int j = 0; j < nZBins_; ++j) {
          ofs2 << "\t" << 0.5 * (histogram_[i][j][1] + histogram_[i][j][2]);
        }
        ofs2 << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "COHz::writeCorrelate Error: failed to open %s\n",
               OHfile.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs2.close();

    if (ofs3.is_open()) {
      Revision r;

      ofs3 << "# " << getCorrFuncType() << " for HH bond vectors in water\n";
      ofs3 << "# OpenMD " << r.getFullRevision() << "\n";
      ofs3 << "# " << r.getBuildDate() << "\n";
      ofs3 << "# selection script1: \"" << selectionScript1_;
      ofs3 << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      ofs3 << "# privilegedAxis computed as " << axisLabel_ << " axis \n";
      if (!paramString_.empty())
        ofs3 << "# parameters: " << paramString_ << "\n";

      ofs3 << "#time\tPn(costheta_z)\n";

      for (unsigned int i = 0; i < nTimeBins_; ++i) {
        ofs3 << times_[i] - times_[0];

        for (unsigned int j = 0; j < nZBins_; ++j) {
          ofs3 << "\t" << histogram_[i][j][3];
        }
        ofs3 << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "COHz::writeCorrelate Error: failed to open %s\n",
               HHfile.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs3.close();
  }